

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O1

int https_file_open(char *filename,int rwmode,int *handle)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  char *err_message;
  uint uVar4;
  char errStr [1200];
  curlmembuf local_508;
  int local_4ec;
  char local_4e8 [1208];
  
  if (netoutfile._0_4_ == 0x3a6d656d) {
    iVar1 = https_open(filename,0,handle);
    return iVar1;
  }
  sVar3 = strlen(netoutfile);
  uVar4 = (uint)sVar3;
  if (uVar4 == 0) {
    ffpmsg("Output file not set, shouldn\'t have happened (https_file_open)");
  }
  else {
    local_508.memory = (char *)0x0;
    local_508.size = 0;
    iVar1 = _setjmp((__jmp_buf_tag *)env);
    if (iVar1 == 0) {
      local_4ec = rwmode;
      signal(0xe,signal_handler);
      alarm(net_timeout);
      iVar2 = https_open_network(filename,&local_508);
      alarm(0);
      signal(0xe,(__sighandler_t)0x0);
      iVar1 = local_4ec;
      if (iVar2 == 0) {
        if (netoutfile[0] == '!') {
          if (0 < (int)uVar4) {
            memmove(netoutfile,netoutfile + 1,(ulong)(uVar4 & 0x7fffffff));
          }
          file_remove(netoutfile);
        }
        iVar2 = file_create(netoutfile,handle);
        if (iVar2 == 0) {
          if (0x16c16c16c16c16 <
              (local_508.size * 0x4fa4fa4fa4fa4fa5 >> 6 |
              local_508.size * 0x4fa4fa4fa4fa4fa5 << 0x3a)) {
            snprintf(local_4e8,0x4b0,"Content-Length not a multiple of 2880 (https_file_open) %zu");
            ffpmsg(local_4e8);
          }
          iVar2 = file_write(*handle,local_508.memory,local_508.size);
          if (iVar2 != 0) {
            ffpmsg("Error copying https file to disk file (https_file_open)");
            ffpmsg(filename);
            ffpmsg(netoutfile);
            free(local_508.memory);
            file_close(*handle);
            return 0x68;
          }
          free(local_508.memory);
          file_close(*handle);
          iVar1 = file_open(netoutfile,iVar1,handle);
          return iVar1;
        }
        ffpmsg("Unable to create output file (https_file_open)");
        err_message = netoutfile;
      }
      else {
        err_message = "Unable to read https file into memory (https_file_open)";
      }
    }
    else {
      alarm(0);
      signal(0xe,(__sighandler_t)0x0);
      ffpmsg("Timeout (https_file_open)");
      snprintf(local_4e8,0x4b0,"Download timeout exceeded: %d seconds",(ulong)net_timeout);
      ffpmsg(local_4e8);
      err_message = "   Timeout may be adjusted with fits_set_timeout";
    }
    ffpmsg(err_message);
    free(local_508.memory);
  }
  return 0x68;
}

Assistant:

int https_file_open(char *filename, int rwmode, int *handle)
{
  int ii, flen;
  char errStr[MAXLEN];
  curlmembuf inmem;
  
  /* Check if output file is actually a memory file */
  if (!strncmp(netoutfile, "mem:", 4) )
  {
     /* allow the memory file to be opened with write access */
     return( https_open(filename, READONLY, handle) );
  }     

  flen = strlen(netoutfile);
  if (!flen)
  {
      /* cfileio made a mistake, we need to know where to write the file */
      ffpmsg("Output file not set, shouldn't have happened (https_file_open)");
      return (FILE_NOT_OPENED);
  }
  
  inmem.memory=0;
  inmem.size=0;
  if (setjmp(env) != 0)
  {
     alarm(0);
     signal(SIGALRM, SIG_DFL);
     ffpmsg("Timeout (https_file_open)");
     snprintf(errStr, MAXLEN, "Download timeout exceeded: %d seconds",net_timeout);
     ffpmsg(errStr);
     ffpmsg("   Timeout may be adjusted with fits_set_timeout");
     free(inmem.memory);
     return (FILE_NOT_OPENED);
  }
  signal(SIGALRM, signal_handler);
  alarm(net_timeout);
  if (https_open_network(filename, &inmem))
  {
     alarm(0);
     signal(SIGALRM, SIG_DFL);
     ffpmsg("Unable to read https file into memory (https_file_open)");
     free(inmem.memory);
     return (FILE_NOT_OPENED);  
  }
  alarm(0);
  signal(SIGALRM, SIG_DFL);
  
  if (*netoutfile == '!')
  {
     /* user wants to clobber disk file, if it already exists */
     for (ii = 0; ii < flen; ii++)
         netoutfile[ii] = netoutfile[ii + 1];  /* remove '!' */

     file_remove(netoutfile);
  }

  /* Create the output file */
  if (file_create(netoutfile,handle)) 
  {
    ffpmsg("Unable to create output file (https_file_open)");
    ffpmsg(netoutfile);
    free(inmem.memory);
    return (FILE_NOT_OPENED);
  }
    
  if (inmem.size % 2880)
  {
    snprintf(errStr, MAXLEN,
	    "Content-Length not a multiple of 2880 (https_file_open) %zu",
	    inmem.size);
    ffpmsg(errStr);
  }
   
  if (file_write(*handle, inmem.memory, inmem.size))
  {
     ffpmsg("Error copying https file to disk file (https_file_open)");
     ffpmsg(filename);
     ffpmsg(netoutfile);
     free(inmem.memory);
     file_close(*handle);
     return (FILE_NOT_OPENED);
  }
  free(inmem.memory); 
  file_close(*handle);
     
  return file_open(netoutfile, rwmode, handle);
}